

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handleapi.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalDuplicateHandle
                    (CPalThread *pThread,HANDLE hSourceProcess,HANDLE hSource,HANDLE hTargetProcess,
                    LPHANDLE phDuplicate,DWORD dwDesiredAccess,BOOL bInheritHandle,DWORD dwOptions)

{
  bool bVar1;
  DWORD DVar2;
  DWORD DVar3;
  DWORD DVar4;
  PAL_ERROR PVar5;
  IPalObject **ppIVar6;
  undefined8 uVar7;
  char *pcVar8;
  IPalObject *local_38;
  
  local_38 = (IPalObject *)0x0;
  DVar2 = GetCurrentProcessId();
  DVar3 = PROCGetProcessIDFromHandle(hSourceProcess);
  DVar4 = PROCGetProcessIDFromHandle(hTargetProcess);
  if (DVar4 == 0 || DVar3 == 0) {
    fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
            ,0x7d);
    pcVar8 = "Can\'t duplicate handle: invalid source or destination process";
LAB_00332580:
    fprintf(_stderr,pcVar8);
    PVar5 = 0x57;
  }
  else {
    if (DVar4 != DVar2 && DVar3 != DVar2) {
      fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
              ,0x87);
      pcVar8 = 
      "Can\'t duplicate handle : neither source or destinationprocesses are from current process";
      goto LAB_00332580;
    }
    if (bInheritHandle == 0) {
      if (3 < dwOptions) {
        fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                ,0x9a);
        pcVar8 = 
        "Can\'t duplicate handle : dwOptions is %#x which is not a subset of (DUPLICATE_SAME_ACCESS|DUPLICATE_CLOSE_SOURCE) (%#x).\n"
        ;
        uVar7 = 3;
LAB_00332627:
        fprintf(_stderr,pcVar8,(ulong)dwOptions,uVar7);
        goto LAB_0033262e;
      }
      if (dwOptions < 2) {
        fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                ,0xa5);
        pcVar8 = 
        "Can\'t duplicate handle : dwOptions is %#x which does not include DUPLICATE_SAME_ACCESS (%#x).\n"
        ;
        uVar7 = 2;
        goto LAB_00332627;
      }
      if (phDuplicate == (LPHANDLE)0x0) {
        PVar5 = 0;
        fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                ,0xac);
        fprintf(_stderr,"Can\'t duplicate handle : lpTargetHandle is NULL.\n");
      }
      else if (DVar3 == DVar2 && DVar4 == DVar2) {
        bVar1 = HandleIsSpecial(hSource);
        if (bVar1) {
          if ((undefined1 *)hSource == &DAT_ffffff01) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033281d;
            ppIVar6 = (IPalObject **)&g_pobjProcess;
          }
          else {
            if ((undefined1 *)hSource != &DAT_ffffff03) {
              fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                      ,0xe4);
              fprintf(_stderr,"Duplication not supported for this special handle (%p)\n",hSource);
              PVar5 = 6;
              goto LAB_00332637;
            }
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033281d;
            ppIVar6 = &pThread->m_pThreadObject;
          }
          local_38 = *ppIVar6;
          (*local_38->_vptr_IPalObject[7])();
        }
        else {
          PVar5 = (**(code **)(*g_pObjectManager + 0x28))
                            (g_pObjectManager,pThread,hSource,&aotDuplicateHandle,dwDesiredAccess,
                             &local_38);
          if (PVar5 != 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033281d;
            goto LAB_00332637;
          }
        }
        PVar5 = (**(code **)(*g_pObjectManager + 0x18))
                          (g_pObjectManager,pThread,local_38,dwDesiredAccess,0,0,phDuplicate);
      }
      else {
        *phDuplicate = hSource;
        PVar5 = 0;
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
              ,0x8e);
      fprintf(_stderr,"Can\'t duplicate handle : bInheritHandle is not FALSE.\n");
LAB_0033262e:
      PVar5 = 0x57;
    }
  }
LAB_00332637:
  if (local_38 != (IPalObject *)0x0) {
    (*local_38->_vptr_IPalObject[8])(local_38,pThread);
  }
  if ((dwOptions & 1) != 0) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_0033281d:
      abort();
    }
    InternalCloseHandle(pThread,hSource);
  }
  return PVar5;
}

Assistant:

PAL_ERROR
CorUnix::InternalDuplicateHandle(
    CPalThread *pThread,
    HANDLE hSourceProcess,
    HANDLE hSource,
    HANDLE hTargetProcess,
    LPHANDLE phDuplicate,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    DWORD dwOptions
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjSource = NULL;
    
    DWORD source_process_id;
    DWORD target_process_id;
    DWORD cur_process_id;

    cur_process_id = GetCurrentProcessId();
    source_process_id = PROCGetProcessIDFromHandle(hSourceProcess);
    target_process_id = PROCGetProcessIDFromHandle(hTargetProcess);

    /* Check validity of process handles */
    if (0 == source_process_id || 0 == target_process_id)
    {
        ASSERT("Can't duplicate handle: invalid source or destination process");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    /* At least source or target process should be the current process. */
    if (source_process_id != cur_process_id
        && target_process_id != cur_process_id)
    {
        ASSERT("Can't duplicate handle : neither source or destination"
               "processes are from current process");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (FALSE != bInheritHandle)
    {
        ASSERT("Can't duplicate handle : bInheritHandle is not FALSE.\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (dwOptions & ~(DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE))
    {
        ASSERT(
            "Can't duplicate handle : dwOptions is %#x which is not "
            "a subset of (DUPLICATE_SAME_ACCESS|DUPLICATE_CLOSE_SOURCE) "
            "(%#x).\n",
            dwOptions,
            DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }
    
    if (0 == (dwOptions & DUPLICATE_SAME_ACCESS))
    {
        ASSERT(
            "Can't duplicate handle : dwOptions is %#x which does not "
            "include DUPLICATE_SAME_ACCESS (%#x).\n",
            dwOptions,
            DUPLICATE_SAME_ACCESS);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (NULL == phDuplicate)
    {
        ASSERT("Can't duplicate handle : lpTargetHandle is NULL.\n");
        goto InternalDuplicateHandleExit;
    }

    /* Since handles can be remoted to others processes using PAL_LocalHsndleToRemote
       and PAL_RemoteHandleToLocal, DuplicateHandle needs some special handling
       when this scenario occurs.

       if hSourceProcessHandle is from another process OR
       hTargetProcessHandle is from another process but both aren't
       ( handled above ) return hSourceHandle.
    */
    if (source_process_id != cur_process_id
        || target_process_id != cur_process_id)
    {
        *phDuplicate = hSource;
        palError = NO_ERROR;
        goto InternalDuplicateHandleExit;
    }

    //
    // Obtain the source IPalObject
    //

    if (!HandleIsSpecial(hSource))
    {
        palError = g_pObjectManager->ReferenceObjectByHandle(
            pThread,
            hSource,
            &aotDuplicateHandle,
            dwDesiredAccess,
            &pobjSource
            );

        if (NO_ERROR != palError)
        {
            ERROR("Unable to get object for source handle %p (%i)\n", hSource, palError);
            goto InternalDuplicateHandleExit;
        }            
    }
    else if (hPseudoCurrentProcess == hSource)
    {
        TRACE("Duplicating process pseudo handle(%p)\n", hSource);

        pobjSource = g_pobjProcess;
        pobjSource->AddReference();
    }
    else if (hPseudoCurrentThread == hSource)
    {
        TRACE("Duplicating thread pseudo handle(%p)\n", hSource);

        pobjSource = pThread->GetThreadObject();
        pobjSource->AddReference();
    }
    else
    {
        ASSERT("Duplication not supported for this special handle (%p)\n", hSource);
        palError = ERROR_INVALID_HANDLE;
        goto InternalDuplicateHandleExit;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pThread,
        pobjSource,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phDuplicate
        );

InternalDuplicateHandleExit:

    if (NULL != pobjSource)
    {
        pobjSource->ReleaseReference(pThread);
    }

    if (dwOptions & DUPLICATE_CLOSE_SOURCE)
    {
        //
        // Since DUPLICATE_CLOSE_SOURCE was specified the source handle
        // MUST be closed, even if an error occurred during the duplication
        // process
        //
        
        TRACE("DuplicateHandle closing source handle %p\n", hSource);
        InternalCloseHandle(pThread, hSource);
    }

    return palError;
}